

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcspn.c
# Opt level: O1

size_t strcspn(char *__s,char *__reject)

{
  char cVar1;
  size_t sVar2;
  char cVar3;
  char *pcVar4;
  
  cVar3 = *__s;
  sVar2 = 0;
  do {
    pcVar4 = __reject;
    if (cVar3 == '\0') {
      return sVar2;
    }
    while (cVar1 = *pcVar4, cVar1 != '\0') {
      pcVar4 = pcVar4 + 1;
      if (cVar3 == cVar1) {
        return sVar2;
      }
    }
    cVar3 = __s[sVar2 + 1];
    sVar2 = sVar2 + 1;
  } while( true );
}

Assistant:

size_t strcspn( const char * s1, const char * s2 )
{
    size_t len = 0;
    const char * p;

    while ( s1[len] )
    {
        p = s2;

        while ( *p )
        {
            if ( s1[len] == *p++ )
            {
                return len;
            }
        }

        ++len;
    }

    return len;
}